

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void uv_sem_post(uv_sem_t *sem)

{
  uv_sem_t *sem_local;
  
  if (platform_needs_custom_semaphore == 0) {
    uv__sem_post(sem);
  }
  else {
    uv__custom_sem_post(sem);
  }
  return;
}

Assistant:

void uv_sem_post(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_post(sem);
  else
    uv__sem_post(sem);
}